

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

void henson::Scheduler::create_group
               (size_t first,size_t last,MPI_Comm parent_comm,MPI_Group *new_group)

{
  undefined4 uVar1;
  vector<int,_std::allocator<int>_> *this;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  int *piVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> group_array;
  MPI_Group parent_group;
  allocator_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  size_type in_stack_ffffffffffffff88;
  size_type local_60;
  vector<int,_std::allocator<int>_> local_40;
  undefined8 local_28;
  undefined8 local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  MPI_Comm_group(in_RDX,&local_28);
  this = (vector<int,_std::allocator<int>_> *)((local_10 - local_8) + 1);
  std::allocator<int>::allocator((allocator<int> *)0x330608);
  std::vector<int,_std::allocator<int>_>::vector
            (this,in_stack_ffffffffffffff88,
             (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  std::allocator<int>::~allocator((allocator<int> *)0x33062d);
  local_60 = 0;
  while( true ) {
    sVar4 = local_60;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_40);
    if (sVar2 <= sVar4) break;
    in_stack_ffffffffffffff84 = (int)local_8 + (int)local_60;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,local_60);
    *pvVar3 = in_stack_ffffffffffffff84;
    local_60 = local_60 + 1;
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_40);
  uVar1 = (undefined4)sVar4;
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x3306ce);
  MPI_Group_incl(local_28,uVar1,piVar5,local_20);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffff84,uVar1));
  return;
}

Assistant:

static void create_group(size_t first, size_t last, MPI_Comm parent_comm, MPI_Group* new_group)
        {
            MPI_Group parent_group;
            MPI_Comm_group(parent_comm, &parent_group);

            std::vector<int> group_array(last - first + 1, -1);
            for(size_t i = 0; i < group_array.size(); ++i)
                group_array[i] = first + i;

            MPI_Group_incl(parent_group, group_array.size(), group_array.data(), new_group);
        }